

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

uint64_t mpack_expect_u64(mpack_reader_t *reader)

{
  mpack_tag_t mVar1;
  mpack_tag_t var;
  mpack_reader_t *reader_local;
  
  mVar1 = mpack_read_tag(reader);
  reader_local = (mpack_reader_t *)mVar1.v;
  if ((mVar1.type != mpack_type_uint) &&
     ((mVar1.type != mpack_type_int || ((long)reader_local < 0)))) {
    mpack_reader_flag_error(reader,mpack_error_type);
    reader_local = (mpack_reader_t *)0x0;
  }
  return (uint64_t)reader_local;
}

Assistant:

uint64_t mpack_expect_u64(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_uint) {
        return var.v.u;
    } else if (var.type == mpack_type_int) {
        if (var.v.i >= 0)
            return (uint64_t)var.v.i;
    }
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0;
}